

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O2

Var Js::JavascriptPromise::EntryAny(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  JavascriptLibrary *this;
  ThreadContext *this_00;
  void *pvVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Var pvVar7;
  JavascriptPromiseCapability *capabilities;
  RecyclableObject *instance;
  RecyclableObject *this_01;
  RecyclableObject *pRVar8;
  JavascriptArray *errors;
  Recycler *pRVar9;
  RecyclableObject *nextFunc;
  JavascriptMethod p_Var10;
  JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyCalledWrapper;
  JavascriptPromiseAnyRejectElementFunction *pJVar11;
  RecyclableObject *this_02;
  JavascriptError *pError;
  int32 hCode;
  int in_stack_00000010;
  undefined1 local_e8 [8];
  AutoTagNativeLibraryEntry __tag;
  TrackAllocData data;
  ArgumentReader args;
  Var local_78;
  CallInfo local_70;
  CallInfo callInfo_local;
  uint32 local_3c;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_70 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x112,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00b9b563;
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)&data.line,&local_70,(Var *)&stack0x00000018);
  if ((local_70._0_4_ >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x113,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
LAB_00b9b563:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_e8,function,local_70,L"Promise.any",&stack0x00000000
            );
  pvVar7 = Arguments::operator[]((Arguments *)&data.line,0);
  capabilities = NewPromiseCapability(pvVar7,pSVar1);
  instance = UnsafeVarTo<Js::RecyclableObject>(pvVar7);
  this = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  pvVar7 = JavascriptOperators::GetProperty(instance,0x134,pSVar1,(PropertyValueInfo *)0x0);
  bVar4 = JavascriptConversion::IsCallable(pvVar7);
  if (!bVar4) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec76,(PCWSTR)0x0);
  }
  this_01 = UnsafeVarTo<Js::RecyclableObject>(pvVar7);
  if ((data.line & 0xfffffe) == 0) {
    pRVar8 = (this->super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  else {
    pRVar8 = (RecyclableObject *)Arguments::operator[]((Arguments *)&data.line,1);
  }
  pRVar8 = JavascriptOperators::GetIterator(pRVar8,pSVar1,false);
  errors = JavascriptLibrary::CreateArray(this);
  __tag.entry.next =
       (Entry *)&JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_79c5325;
  data.filename._0_4_ = 0x142;
  pRVar9 = Memory::Recycler::TrackAllocInfo(pSVar1->recycler,(TrackAllocData *)&__tag.entry.next);
  callInfo_local = (CallInfo)new<Memory::Recycler>(4,pRVar9,0x51e21e);
  *(undefined4 *)callInfo_local = 1;
  local_78 = (Var)0x0;
  nextFunc = JavascriptOperators::CacheIteratorNext(pRVar8,pSVar1);
  local_3c = 0;
  while( true ) {
    bVar4 = JavascriptOperators::IteratorStepAndValue(pRVar8,pSVar1,nextFunc,&local_78);
    pvVar7 = local_78;
    if (!bVar4) {
      *(int *)callInfo_local = *(int *)callInfo_local + -1;
      if (*(int *)callInfo_local != 0) {
        pvVar2 = (capabilities->promise).ptr;
        AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_e8)
        ;
        return pvVar2;
      }
      pError = JavascriptLibrary::CreateAggregateError(this);
      JavascriptError::SetErrorsList(pError,errors,pSVar1);
      JavascriptError::SetErrorMessage(pError,-0x7ff5ea0a,L"",pSVar1);
      JavascriptExceptionOperators::Throw(pError,pSVar1);
    }
    JavascriptArray::DirectAppendItem(errors,(this->super_JavascriptLibraryBase).undefinedValue.ptr)
    ;
    this_00 = pSVar1->threadContext;
    bVar4 = this_00->reentrancySafeOrHandled;
    this_00->reentrancySafeOrHandled = true;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    ThreadContext::AssertJsReentrancy(this_00);
    p_Var10 = RecyclableObject::GetEntryPoint(this_01);
    CheckIsExecutable(this_01,p_Var10);
    p_Var10 = RecyclableObject::GetEntryPoint(this_01);
    pvVar7 = (*p_Var10)(this_01,(CallInfo)this_01,0x2000002,0,0,0,0,0x2000002,instance,pvVar7);
    this_00->reentrancySafeOrHandled = bVar4;
    __tag.entry.next =
         (Entry *)&JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_79c5325;
    data.filename._0_4_ = 0x15c;
    pRVar9 = Memory::Recycler::TrackAllocInfo(pSVar1->recycler,(TrackAllocData *)&__tag.entry.next);
    alreadyCalledWrapper =
         (JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *)
         new<Memory::Recycler>(1,pRVar9,0x51e21e);
    alreadyCalledWrapper->alreadyResolved = false;
    pJVar11 = JavascriptLibrary::CreatePromiseAnyRejectElementFunction
                        (this,EntryAnyRejectElementFunction,local_3c,errors,capabilities,
                         (JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *)
                         callInfo_local,alreadyCalledWrapper);
    *(int *)callInfo_local = *(int *)callInfo_local + 1;
    BVar5 = JavascriptConversion::ToObject(pvVar7,pSVar1,(RecyclableObject **)&__tag.entry.next);
    if (BVar5 == 0) break;
    pvVar7 = JavascriptOperators::GetProperty
                       ((RecyclableObject *)__tag.entry.next,0x169,pSVar1,(PropertyValueInfo *)0x0);
    bVar4 = JavascriptConversion::IsCallable(pvVar7);
    if (!bVar4) {
      hCode = -0x7ff5ec76;
      goto LAB_00b9b556;
    }
    this_02 = UnsafeVarTo<Js::RecyclableObject>(pvVar7);
    bVar4 = this_00->reentrancySafeOrHandled;
    this_00->reentrancySafeOrHandled = true;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(pSVar1->threadContext);
    ThreadContext::AssertJsReentrancy(pSVar1->threadContext);
    p_Var10 = RecyclableObject::GetEntryPoint(this_02);
    CheckIsExecutable(this_02,p_Var10);
    p_Var10 = RecyclableObject::GetEntryPoint(this_02);
    (*p_Var10)(this_02,(CallInfo)this_02,0x2000003,0,0,0,0,0x2000003,__tag.entry.next,
               (capabilities->resolve).ptr,pJVar11);
    this_00->reentrancySafeOrHandled = bVar4;
    local_3c = local_3c + 1;
  }
  hCode = -0x7ff5ec71;
LAB_00b9b556:
  JavascriptError::ThrowTypeError(pSVar1,hCode,(PCWSTR)0x0);
}

Assistant:

Var JavascriptPromise::EntryAny(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Promise.any"));

        // 1. Let C be the this value.
        Var C = args[0];

        // 2. Let promiseCapability be ? NewPromiseCapability(C).
        JavascriptPromiseCapability* promiseCapability = NewPromiseCapability(C, scriptContext);
        RecyclableObject* constructor = UnsafeVarTo<RecyclableObject>(C);

        JavascriptLibrary* library = scriptContext->GetLibrary();
        RecyclableObject* promiseResolve = nullptr;
        RecyclableObject* iteratorRecord = nullptr;
        try {
            // 3. Let promiseResolve be GetPromiseResolve(C).
            // 4. IfAbruptRejectPromise(promiseResolve, promiseCapability).
            Var resolveVar = JavascriptOperators::GetProperty(constructor, Js::PropertyIds::resolve, scriptContext);
            if (!JavascriptConversion::IsCallable(resolveVar))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
            }
            promiseResolve = UnsafeVarTo<RecyclableObject>(resolveVar);

            // 5. Let iteratorRecord be GetIterator(iterable).
            // 6. IfAbruptRejectPromise(iteratorRecord, promiseCapability).
            Var iterable = args.Info.Count > 1 ? args[1] : library->GetUndefined();
            iteratorRecord = JavascriptOperators::GetIterator(iterable, scriptContext); 
        }
        catch (const JavascriptException& err)
        {
            JavascriptExceptionObject* exception = err.GetAndClear();
            return JavascriptPromise::CreateRejectedPromise(exception->GetThrownObject(scriptContext), scriptContext);
        }

        // Abstract operation PerformPromiseAny
        // 7. Let result be PerformPromiseAny(iteratorRecord, C, promiseCapability, promiseResolve).
        try {
            // 1. Assert: ! IsConstructor(constructor) is true. 
            // 2. Assert: resultCapability is a PromiseCapability Record.
            // 3. Assert: ! IsCallable(promiseResolve) is true.
            // 4. Let errors be a new empty List.
            JavascriptArray* errors = library->CreateArray();

            // 5. Let remainingElementsCount be a new Record { [[Value]]: 1 }.
            JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* remainingElementsWrapper = RecyclerNewStructZ(scriptContext->GetRecycler(), JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper);
            remainingElementsWrapper->remainingElements = 1;

            // 6. Let index be 0.
            uint32 index = 0;

            // 7. Repeat,
            JavascriptOperators::DoIteratorStepAndValue(iteratorRecord, scriptContext, [&](Var nextValue) {
                // a. Let next be IteratorStep(iteratorRecord).
                // e. Let nextValue be IteratorValue(next).
                // h. Append undefined to errors.
                errors->DirectAppendItem(library->GetUndefined());

                // i. Let nextPromise be ? Call(promiseResolve, constructor, << nextValue >> ).
                ThreadContext* threadContext = scriptContext->GetThreadContext();
                Var nextPromise = nullptr;
                BEGIN_SAFE_REENTRANT_CALL(threadContext);
                {
                    nextPromise = CALL_FUNCTION(threadContext,
                        promiseResolve, Js::CallInfo(CallFlags_Value, 2),
                        constructor,
                        nextValue);
                }
                END_SAFE_REENTRANT_CALL;


                JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyCalledWrapper = RecyclerNewStructZ(scriptContext->GetRecycler(), JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper);
                alreadyCalledWrapper->alreadyResolved = false;

                // j. Let steps be the algorithm steps defined in Promise.any Reject Element Functions.
                // k. Let rejectElement be ! CreateBuiltinFunction(steps, << [[AlreadyCalled]], [[Index]], [[Errors]], [[Capability]], [[RemainingElements]] >> ).
                // p. Set rejectElement.[[RemainingElements]] to remainingElementsCount.
                Var rejectElement = library->CreatePromiseAnyRejectElementFunction(EntryAnyRejectElementFunction, index, errors, promiseCapability, remainingElementsWrapper, alreadyCalledWrapper);

                // q. Set remainingElementsCount.[[Value]] to remainingElementsCount.[[Value]] + 1.
                remainingElementsWrapper->remainingElements++;

                // r. Perform ? Invoke(nextPromise, "then", << resultCapability.[[Resolve]], rejectElement >> ).
                RecyclableObject* nextPromiseObject;
                if (!JavascriptConversion::ToObject(nextPromise, scriptContext, &nextPromiseObject))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject);
                }
                Var thenVar = JavascriptOperators::GetProperty(nextPromiseObject, Js::PropertyIds::then, scriptContext);
                if (!JavascriptConversion::IsCallable(thenVar))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
                }

                RecyclableObject* thenFunc = UnsafeVarTo<RecyclableObject>(thenVar);

                BEGIN_SAFE_REENTRANT_CALL(threadContext)
                {
                    CALL_FUNCTION(scriptContext->GetThreadContext(),
                        thenFunc, Js::CallInfo(CallFlags_Value, 3),
                        nextPromiseObject,
                        promiseCapability->GetResolve(),
                        rejectElement);
                }
                END_SAFE_REENTRANT_CALL;

                // s.Increase index by 1.
                index++;
            });

            // 7.d. If next is false, then
            // 7.d.i. Set iteratorRecord.[[Done]] to true.
            // 7.d.ii. Set remainingElementsCount.[[Value]] to remainingElementsCount.[[Value]] - 1.
            remainingElementsWrapper->remainingElements--;
            // 7.d.iii. If remainingElementsCount.[[Value]] is 0, then
            if (remainingElementsWrapper->remainingElements == 0)
            {
                // 7.d.iii.1 Let error be a newly created AggregateError object.
                JavascriptError* pError = library->CreateAggregateError();
                JavascriptError::SetErrorsList(pError, errors, scriptContext);
                JavascriptError::SetErrorMessage(pError, JSERR_PromiseAllRejected, _u(""), scriptContext);
                JavascriptExceptionOperators::Throw(pError, scriptContext);
            }
        }
        catch (const JavascriptException& err)
        {
            // 8. If result is an abrupt completion, then
            //   a. If iteratorRecord.[[Done]] is false, set result to IteratorClose(iteratorRecord, result).
            //   b. IfAbruptRejectPromise(result, promiseCapability).
            JavascriptExceptionObject* exception = err.GetAndClear();
            TryRejectWithExceptionObject(exception, promiseCapability->GetReject(), scriptContext);
        }

        return promiseCapability->GetPromise();
    }